

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImplX11::updateLastInputTime(WindowImplX11 *this,Time time)

{
  Atom AVar1;
  allocator<char> local_41;
  Time time_local;
  string local_38;
  
  if ((time != 0) && (this->m_lastInputTime != time)) {
    time_local = time;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"_NET_WM_USER_TIME",&local_41);
    AVar1 = getAtom(&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
    if (AVar1 != 0) {
      XChangeProperty(this->m_display,this->m_window,AVar1,6,0x20,0,&time_local,1);
      time = time_local;
    }
    this->m_lastInputTime = time;
  }
  return;
}

Assistant:

void WindowImplX11::updateLastInputTime(::Time time)
{
    if (time && (time != m_lastInputTime))
    {
        Atom netWmUserTime = getAtom("_NET_WM_USER_TIME", true);

        if (netWmUserTime)
        {
            XChangeProperty(m_display,
                            m_window,
                            netWmUserTime,
                            XA_CARDINAL,
                            32,
                            PropModeReplace,
                            reinterpret_cast<const unsigned char*>(&time),
                            1);
        }

        m_lastInputTime = time;
    }
}